

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void __thiscall
Js::JavascriptLibrary::SetDebugObjectFaultInjectionCookieGetterAccessor
          (JavascriptLibrary *this,FunctionInfo *funcGetter,FunctionInfo *funcSetter)

{
  code *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  undefined4 uVar6;
  undefined8 uVar5;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  if (funcGetter == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x750,"(funcGetter)","funcGetter");
    if (!bVar2) goto LAB_00bd90ad;
    *puVar3 = 0;
  }
  if (funcSetter == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x751,"(funcSetter)","funcSetter");
    if (!bVar2) {
LAB_00bd90ad:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pJVar4 = CreateNonProfiledFunction(this,funcGetter);
  Memory::Recycler::WBSetBit((char *)&this->debugObjectFaultInjectionCookieGetterFunction);
  (this->debugObjectFaultInjectionCookieGetterFunction).ptr = pJVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&this->debugObjectFaultInjectionCookieGetterFunction);
  pJVar4 = (this->debugObjectFaultInjectionCookieGetterFunction).ptr;
  uVar5 = CONCAT44(uVar6,0xf);
  (*(pJVar4->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (pJVar4,0xd1,0x1000000000000,2,0,0,uVar5);
  uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
  pJVar4 = CreateNonProfiledFunction(this,funcSetter);
  Memory::Recycler::WBSetBit((char *)&this->debugObjectFaultInjectionCookieSetterFunction);
  (this->debugObjectFaultInjectionCookieSetterFunction).ptr = pJVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier
            (&this->debugObjectFaultInjectionCookieSetterFunction);
  pJVar4 = (this->debugObjectFaultInjectionCookieSetterFunction).ptr;
  (*(pJVar4->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (pJVar4,0xd1,&DAT_1000000000001,2,0,0,CONCAT44(uVar6,0xf));
  return;
}

Assistant:

void JavascriptLibrary::SetDebugObjectFaultInjectionCookieGetterAccessor(FunctionInfo *funcGetter, FunctionInfo *funcSetter)
    {
        Assert(funcGetter);
        Assert(funcSetter);

        debugObjectFaultInjectionCookieGetterFunction = CreateNonProfiledFunction(funcGetter);
        debugObjectFaultInjectionCookieGetterFunction->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable, nullptr);

        debugObjectFaultInjectionCookieSetterFunction = CreateNonProfiledFunction(funcSetter);
        debugObjectFaultInjectionCookieSetterFunction->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable, nullptr);
    }